

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O1

int __thiscall zmq::ipc_listener_t::set_local_address(ipc_listener_t *this,char *addr_)

{
  string *addr__00;
  socket_base_t *this_00;
  int iVar1;
  fd_t __fd;
  socklen_t __len;
  int iVar2;
  int *piVar3;
  sockaddr *__addr;
  int tmp_errno;
  string addr;
  ipc_address_t address;
  string local_100;
  endpoint_uri_pair_t local_e0;
  ipc_address_t local_94;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,addr_,(allocator<char> *)&local_94);
  if (((this->super_stream_listener_base_t).super_own_t.options.use_fd == -1) &&
     (*local_100._M_dataplus._M_p == '*')) {
    iVar1 = create_ipc_wildcard_address(&this->_tmp_socket_dirname,&local_100);
    if (iVar1 < 0) {
      iVar1 = -1;
      goto LAB_00194b8d;
    }
  }
  if ((this->super_stream_listener_base_t).super_own_t.options.use_fd == -1) {
    unlink(local_100._M_dataplus._M_p);
  }
  (this->_filename)._M_string_length = 0;
  *(this->_filename)._M_dataplus._M_p = '\0';
  ipc_address_t::ipc_address_t(&local_94);
  iVar1 = ipc_address_t::resolve(&local_94,local_100._M_dataplus._M_p);
  if (iVar1 == 0) {
    addr__00 = &(this->super_stream_listener_base_t)._endpoint;
    ipc_address_t::to_string(&local_94,addr__00);
    iVar1 = (this->super_stream_listener_base_t).super_own_t.options.use_fd;
    if (iVar1 == -1) {
      __fd = open_socket(1,1,0);
      (this->super_stream_listener_base_t)._s = __fd;
      if (__fd == -1) goto LAB_00194a22;
      __addr = ipc_address_t::addr(&local_94);
      __len = ipc_address_t::addrlen(&local_94);
      iVar2 = bind(__fd,(sockaddr *)__addr,__len);
      iVar1 = (int)__addr;
      if (iVar2 == 0) {
        iVar1 = (this->super_stream_listener_base_t).super_own_t.options.backlog;
        iVar2 = listen((this->super_stream_listener_base_t)._s,iVar1);
        if (iVar2 == 0) goto LAB_00194a8e;
      }
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      close(this,iVar1);
      *piVar3 = iVar2;
      iVar1 = -1;
    }
    else {
      (this->super_stream_listener_base_t)._s = iVar1;
LAB_00194a8e:
      std::__cxx11::string::operator=((string *)&this->_filename,(string *)&local_100);
      this->_has_file = true;
      this_00 = (this->super_stream_listener_base_t)._socket;
      make_unconnected_bind_endpoint_pair(&local_e0,addr__00);
      socket_base_t::event_listening(this_00,&local_e0,(this->super_stream_listener_base_t)._s);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.remote._M_dataplus._M_p != &local_e0.remote.field_2) {
        operator_delete(local_e0.remote._M_dataplus._M_p,
                        local_e0.remote.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.local._M_dataplus._M_p != &local_e0.local.field_2) {
        operator_delete(local_e0.local._M_dataplus._M_p,
                        local_e0.local.field_2._M_allocated_capacity + 1);
      }
      iVar1 = 0;
    }
  }
  else {
LAB_00194a22:
    iVar1 = -1;
    if ((this->_tmp_socket_dirname)._M_string_length != 0) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      rmdir((this->_tmp_socket_dirname)._M_dataplus._M_p);
      (this->_tmp_socket_dirname)._M_string_length = 0;
      *(this->_tmp_socket_dirname)._M_dataplus._M_p = '\0';
      *piVar3 = iVar2;
    }
  }
  ipc_address_t::~ipc_address_t(&local_94);
LAB_00194b8d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int zmq::ipc_listener_t::set_local_address (const char *addr_)
{
    //  Create addr on stack for auto-cleanup
    std::string addr (addr_);

    //  Allow wildcard file
    if (options.use_fd == -1 && addr[0] == '*') {
        if (create_ipc_wildcard_address (_tmp_socket_dirname, addr) < 0) {
            return -1;
        }
    }

    //  Get rid of the file associated with the UNIX domain socket that
    //  may have been left behind by the previous run of the application.
    //  MUST NOT unlink if the FD is managed by the user, or it will stop
    //  working after the first client connects. The user will take care of
    //  cleaning up the file after the service is stopped.
    if (options.use_fd == -1) {
        ::unlink (addr.c_str ());
    }
    _filename.clear ();

    //  Initialise the address structure.
    ipc_address_t address;
    int rc = address.resolve (addr.c_str ());
    if (rc != 0) {
        if (!_tmp_socket_dirname.empty ()) {
            // We need to preserve errno to return to the user
            const int tmp_errno = errno;
            ::rmdir (_tmp_socket_dirname.c_str ());
            _tmp_socket_dirname.clear ();
            errno = tmp_errno;
        }
        return -1;
    }

    address.to_string (_endpoint);

    if (options.use_fd != -1) {
        _s = options.use_fd;
    } else {
        //  Create a listening socket.
        _s = open_socket (AF_UNIX, SOCK_STREAM, 0);
        if (_s == retired_fd) {
            if (!_tmp_socket_dirname.empty ()) {
                // We need to preserve errno to return to the user
                const int tmp_errno = errno;
                ::rmdir (_tmp_socket_dirname.c_str ());
                _tmp_socket_dirname.clear ();
                errno = tmp_errno;
            }
            return -1;
        }

        //  Bind the socket to the file path.
        rc = bind (_s, const_cast<sockaddr *> (address.addr ()),
                   address.addrlen ());
        if (rc != 0)
            goto error;

        //  Listen for incoming connections.
        rc = listen (_s, options.backlog);
        if (rc != 0)
            goto error;
    }

    _filename = ZMQ_MOVE (addr);
    _has_file = true;

    _socket->event_listening (make_unconnected_bind_endpoint_pair (_endpoint),
                              _s);
    return 0;

error:
    const int err = errno;
    close ();
    errno = err;
    return -1;
}